

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::HangingHttpService::request
          (HangingHttpService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *responseSender)

{
  PromiseArena *pPVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4626:36)>_2
  aVar3;
  AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4626:36)>_>
  *location;
  Promise<void> result;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_58;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4626:36)>
  local_50;
  Own<kj::_::AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4626:36)>_>,_kj::_::PromiseDisposer>
  local_40;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4626:36)>
  local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  aVar3._4_4_ = in_register_00000034;
  aVar3._0_4_ = method;
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)&local_58);
  *(int *)((long)aVar3 + 8) = *(int *)((long)aVar3 + 8) + 1;
  local_50.maybeFunc.ptr.isSet = true;
  local_38.maybeFunc.ptr.isSet = false;
  pPVar1 = ((local_58.ptr)->super_PromiseArenaMember).arena;
  local_50.maybeFunc.ptr.field_1 = aVar3;
  local_38.maybeFunc.ptr.field_1 = aVar3;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_58.ptr - (long)pPVar1) < 0x28) {
    pvVar2 = operator_new(0x400);
    location = (AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4626:36)>_>
                *)((long)pvVar2 + 0x3d8);
    ctor<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::(anonymous_namespace)::HangingHttpService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda()_1_>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::Deferred<kj::(anonymous_namespace)::HangingHttpService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda()_1_>>
              (location,&local_58,&local_50);
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    ((local_58.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location = (AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4626:36)>_>
                *)&local_58.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::(anonymous_namespace)::HangingHttpService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda()_1_>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::Deferred<kj::(anonymous_namespace)::HangingHttpService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda()_1_>>
              (location,&local_58,&local_50);
    local_58.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_40.ptr = (AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4626:36)>_>
                  *)0x0;
  (this->super_HttpService)._vptr_HttpService = (_func_int **)location;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::AttachmentPromiseNode<kj::_::Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:4626:36)>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_40);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:4626:36)>
  ::~Deferred(&local_50);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:4626:36)>
  ::~Deferred(&local_38);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& responseSender) override {
    kj::Promise<void> result = kj::NEVER_DONE;
    ++inFlight;
    return result.attach(kj::defer([this]() {
      if (--inFlight == 0) {
        KJ_IF_SOME(f, onCancelFulfiller) {
          f->fulfill();
        }
      }
    }));
  }